

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

int Str_MuxTryOnce(Gia_Man_t *pNew,Str_Ntk_t *pNtk,Str_Mux_t *pTree,Str_Mux_t *pRoot,int Edge,
                  Vec_Int_t *vDelay,int fVerbose)

{
  Str_Mux_t *pTree_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint k;
  uint uVar5;
  ulong uVar6;
  uint i;
  int nLength;
  Str_Mux_t pBackup [3];
  int pPath [10000];
  Vec_Int_t *pVVar7;
  uint local_9d7c;
  uint local_9d5c;
  Str_Mux_t *local_9d58;
  Gia_Man_t *local_9d50;
  Vec_Int_t *local_9d48;
  ulong local_9d40;
  Str_Mux_t local_9d38 [3];
  int local_9c78 [10002];
  
  local_9d58 = pTree;
  local_9d48 = vDelay;
  uVar1 = Str_MuxDelayEdge_rec(pRoot,Edge);
  local_9d5c = 0;
  iVar2 = Str_MuxFindPathEdge_rec(pRoot,Edge,local_9c78,(int *)&local_9d5c);
  uVar5 = local_9d5c;
  if (iVar2 != 0) {
    uVar6 = (ulong)local_9d5c;
    local_9d50 = pNew;
    if (fVerbose != 0) {
      printf("Trying node %d with path of length %d.\n",(ulong)(uint)pRoot->Id,uVar6);
    }
    if (0 < (int)uVar5) {
      iVar2 = uVar5 - 2;
      local_9d7c = 0xffffffff;
      uVar3 = 0;
      i = 0;
      uVar5 = uVar1;
      local_9d40 = uVar6;
      do {
        k = i + 2;
        if ((int)k < (int)uVar6) {
          uVar3 = uVar3 + iVar2;
          do {
            pTree_00 = local_9d58;
            Str_MuxChangeOnce(local_9d58,local_9c78,i,k,local_9d38,(Gia_Man_t *)0x0,(Vec_Int_t *)0x0
                             );
            uVar4 = Str_MuxDelayEdge_rec(pRoot,Edge);
            Str_MuxChangeUndo(pTree_00,local_9c78,i,k,local_9d38);
            if (((int)uVar4 < (int)uVar5) || ((0 < (int)local_9d7c && (uVar5 == uVar4)))) {
              local_9d7c = k | i << 0x10;
              uVar5 = uVar4;
            }
            if (fVerbose != 0) {
              printf("%2d %2d -> %3d (%3d)\n",(ulong)i,(ulong)k,(ulong)uVar4);
            }
            k = k + 1;
            uVar6 = local_9d40;
          } while ((uint)local_9d40 != k);
        }
        i = i + 1;
        iVar2 = iVar2 + -1;
      } while (i != (uint)uVar6);
      if (local_9d7c != 0xffffffff) {
        pVVar7 = local_9d48;
        Str_MuxChangeOnce(local_9d58,local_9c78,(int)local_9d7c >> 0x10,local_9d7c & 0xffff,
                          (Str_Mux_t *)0x0,local_9d50,local_9d48);
        if (fVerbose == 0) {
          return 1;
        }
        printf("Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n",(ulong)(uint)pRoot->Id,
               (ulong)(uint)((int)local_9d7c >> 0x10),(ulong)(local_9d7c & 0xffff),(ulong)uVar3,
               (ulong)uVar1,CONCAT44((int)((ulong)pVVar7 >> 0x20),uVar5));
        putchar(10);
        return 1;
      }
    }
    if (fVerbose != 0) {
      puts("Did not find!");
    }
  }
  return 0;
}

Assistant:

int Str_MuxTryOnce( Gia_Man_t * pNew, Str_Ntk_t * pNtk, Str_Mux_t * pTree, Str_Mux_t * pRoot, int Edge, Vec_Int_t * vDelay, int fVerbose )
{
    int pPath[MAX_TREE];
    Str_Mux_t pBackup[3];
    int Delay, DelayBest = Str_MuxDelayEdge_rec( pRoot, Edge ), DelayInit = DelayBest;
    int i, k, nLength = 0, ForkBest = -1, nChecks = 0;
    int RetValue = Str_MuxFindPathEdge_rec( pRoot, Edge, pPath, &nLength );
    if ( RetValue == 0 )
        return 0;
    if ( fVerbose )
        printf( "Trying node %d with path of length %d.\n", pRoot->Id, nLength );
    for ( i = 0; i < nLength; i++ )
    for ( k = i+2; k < nLength; k++ )
    {
        Str_MuxChangeOnce( pTree, pPath, i, k, pBackup, NULL, NULL );
        Delay = Str_MuxDelayEdge_rec( pRoot, Edge );
        Str_MuxChangeUndo( pTree, pPath, i, k, pBackup );
        if ( DelayBest > Delay || (ForkBest > 0 && DelayBest == Delay) )
            DelayBest = Delay, ForkBest = (i << 16) | k;
        if ( fVerbose )
            printf( "%2d %2d -> %3d (%3d)\n", i, k, Delay, DelayBest );
        nChecks++;
    }
    if ( ForkBest == -1 )
    {
        if ( fVerbose )
            printf( "Did not find!\n" );
        return 0;
    }
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    Str_MuxChangeOnce( pTree, pPath, ForkBest >> 16, ForkBest & 0xFFFF, NULL, pNew, vDelay );
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    if ( fVerbose )
        printf( "Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n", 
            pRoot->Id, ForkBest >> 16, ForkBest & 0xFFFF, nChecks, DelayInit, DelayBest );
    if ( fVerbose )
        printf( "\n" );
    return 1;
}